

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

void __thiscall ON_SubD::ClearFragmentColors(ON_SubD *this,bool bClearFragmentColorsMappingTag)

{
  bool bVar1;
  undefined8 uVar2;
  uint uVar3;
  ON_SubDimple *pOVar4;
  ON_SubDMeshFragment *this_00;
  ON_SubDMeshFragmentIterator fragit;
  
  pOVar4 = SubDimple(this);
  if (pOVar4 != (ON_SubDimple *)0x0) {
    ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator(&fragit,this);
    this_00 = ON_SubDMeshFragmentIterator::FirstFragment(&fragit);
    bVar1 = false;
    while (this_00 != (ON_SubDMeshFragment *)0x0) {
      if (!bVar1) {
        uVar3 = ON_SubDMeshFragment::ColorCount(this_00);
        if (uVar3 != 0) {
          bVar1 = true;
        }
      }
      ON_SubDMeshFragment::ClearColors(this_00);
      this_00 = ON_SubDMeshFragmentIterator::NextFragment(&fragit);
    }
    if (bClearFragmentColorsMappingTag) {
      *(undefined4 *)((pOVar4->m_fragment_colors_settings_hash).m_digest + 0x10) =
           ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
      uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
      *(undefined8 *)(pOVar4->m_fragment_colors_settings_hash).m_digest =
           ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
      *(undefined8 *)((pOVar4->m_fragment_colors_settings_hash).m_digest + 8) = uVar2;
      SetColorsMappingTag(this,&ON_MappingTag::Unset);
    }
    if (bVar1) {
      ChangeRenderContentSerialNumber(this);
    }
    ON_SubDMeshFragmentIterator::~ON_SubDMeshFragmentIterator(&fragit);
  }
  return;
}

Assistant:

void ON_SubD::ClearFragmentColors(
  bool bClearFragmentColorsMappingTag
)
{
  const ON_SubDimple* subdimple = this->SubDimple();
  if (nullptr != subdimple)
  {
    bool bFragmentsChanged = false;
    ON_SubDMeshFragmentIterator fragit(*this);
    for (const ON_SubDMeshFragment* frag = fragit.FirstFragment(); nullptr != frag; frag = fragit.NextFragment())
    {
      if (false == bFragmentsChanged && frag->ColorCount() > 0)
        bFragmentsChanged = true;
      frag->SetColorsExistForExperts(false);
    }
    if (bClearFragmentColorsMappingTag)
    {
      subdimple->Internal_SetFragmentColorsSettingsHash(ON_SHA1_Hash::EmptyContentHash);
      this->SetColorsMappingTag(ON_MappingTag::Unset);
    }
    if (bFragmentsChanged)
      this->ChangeRenderContentSerialNumber();
  }
}